

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tables.c
# Opt level: O1

void dump_value(int indent,amqp_field_value_t v,FILE *out)

{
  amqp_field_value_t v_00;
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  uint __c;
  long lVar4;
  float fVar5;
  
  iVar1 = indent;
  if (0 < indent) {
    do {
      fputc(0x20,(FILE *)out);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  __c = (uint)v.kind;
  fputc(__c,(FILE *)out);
  fVar5 = v.value._0_4_;
  if (v.kind < 0x56) {
    switch(__c) {
    case 0x41:
      fputc(10,(FILE *)out);
      lVar4 = (long)(int)fVar5;
      if (0 < lVar4) {
        do {
          dump_value(indent + 2,*v.value.array.entries,out);
          v.value._8_8_ = v.value._8_8_ + 0x18;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      break;
    case 0x42:
      uVar3 = (ulong)v.value.u8;
      goto LAB_00101f21;
    case 0x44:
      fprintf((FILE *)out," %d:::%u\n",(ulong)v.value.u8,(ulong)v.value.decimal.value);
      return;
    case 0x46:
      fputc(10,(FILE *)out);
      if (0 < (long)(int)fVar5) {
        lVar4 = 0;
        do {
          iVar1 = indent + 2;
          if (-2 < indent) {
            do {
              fputc(0x20,(FILE *)out);
              iVar1 = iVar1 + -1;
            } while (iVar1 != 0);
          }
          fprintf((FILE *)out,"%.*s ->\n",(ulong)*(uint *)((long)v.value.bytes.bytes + lVar4 * 0x28)
                  ,*(undefined8 *)((long)v.value.bytes.bytes + lVar4 * 0x28 + 8));
          v_00.value.bytes.bytes =
               (void *)*(undefined8 *)((long)v.value.bytes.bytes + lVar4 * 0x28 + 0x20);
          v_00._0_16_ = *(undefined1 (*) [16])((long)v.value.bytes.bytes + lVar4 * 0x28 + 0x10);
          dump_value(indent + 4,v_00,out);
          lVar4 = lVar4 + 1;
        } while (lVar4 != (int)fVar5);
      }
      break;
    case 0x49:
      uVar3 = (ulong)(uint)fVar5;
      goto LAB_00101f56;
    default:
      if (__c == 0x53) {
        fprintf((FILE *)out," %.*s\n",(ulong)(uint)fVar5,v.value.bytes.bytes);
        return;
      }
      if (__c == 0x54) {
        pcVar2 = " %lu\n";
        goto LAB_00101ecd;
      }
    case 0x43:
    case 0x45:
    case 0x47:
    case 0x48:
switchD_00101c7b_caseD_63:
      fwrite("???\n",4,1,(FILE *)out);
      return;
    }
    return;
  }
  switch(__c) {
  case 0x62:
    uVar3 = (ulong)(uint)(int)v.value.i8;
    break;
  case 99:
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x72:
    goto switchD_00101c7b_caseD_63;
  case 100:
    goto LAB_00101f31;
  case 0x66:
    fVar5 = SUB84((double)fVar5,0);
LAB_00101f31:
    fprintf((FILE *)out," %g\n",fVar5);
    return;
  case 0x69:
    uVar3 = (ulong)(uint)fVar5;
    goto LAB_00101f21;
  case 0x6c:
    pcVar2 = " %ld\n";
LAB_00101ecd:
    fprintf((FILE *)out,pcVar2,v.value._0_8_);
    return;
  case 0x73:
    uVar3 = (ulong)(uint)(int)(short)v.value._0_2_;
    break;
  case 0x74:
    pcVar2 = " true\n";
    if (fVar5 == 0.0) {
      pcVar2 = " false\n";
    }
    fputs(pcVar2,(FILE *)out);
    return;
  case 0x75:
    uVar3 = (ulong)v.value._0_2_;
LAB_00101f21:
    pcVar2 = " %u\n";
    goto LAB_00101f5d;
  default:
    if (__c != 0x56) {
      if (__c != 0x78) goto switchD_00101c7b_caseD_63;
      fputc(0x20,(FILE *)out);
      if (0 < (int)fVar5) {
        uVar3 = 0;
        do {
          fprintf((FILE *)out,"%02x",(ulong)(uint)(int)*(char *)((long)v.value.bytes.bytes + uVar3))
          ;
          uVar3 = uVar3 + 1;
        } while ((uint)ABS(fVar5) != uVar3);
      }
    }
    fputc(10,(FILE *)out);
    return;
  }
LAB_00101f56:
  pcVar2 = " %d\n";
LAB_00101f5d:
  fprintf((FILE *)out,pcVar2,uVar3);
  return;
}

Assistant:

static void dump_value(int indent, amqp_field_value_t v, FILE *out)
{
  int i;

  dump_indent(indent, out);
  fputc(v.kind, out);

  switch (v.kind) {
  case AMQP_FIELD_KIND_BOOLEAN:
    fputs(v.value.boolean ? " true\n" : " false\n", out);
    break;

  case AMQP_FIELD_KIND_I8:
    fprintf(out, " %"PRId8"\n", v.value.i8);
    break;

  case AMQP_FIELD_KIND_U8:
    fprintf(out, " %"PRIu8"\n", v.value.u8);
    break;

  case AMQP_FIELD_KIND_I16:
    fprintf(out, " %"PRId16"\n", v.value.i16);
    break;

  case AMQP_FIELD_KIND_U16:
    fprintf(out, " %"PRIu16"\n", v.value.u16);
    break;

  case AMQP_FIELD_KIND_I32:
    fprintf(out, " %"PRId32"\n", v.value.i32);
    break;

  case AMQP_FIELD_KIND_U32:
    fprintf(out, " %"PRIu32"\n", v.value.u32);
    break;

  case AMQP_FIELD_KIND_I64:
    fprintf(out, " %"PRId64"\n", v.value.i64);
    break;

  case AMQP_FIELD_KIND_F32:
    fprintf(out, " %g\n", (double) v.value.f32);
    break;

  case AMQP_FIELD_KIND_F64:
    fprintf(out, " %g\n", v.value.f64);
    break;

  case AMQP_FIELD_KIND_DECIMAL:
    fprintf(out, " %d:::%u\n", v.value.decimal.decimals,
            v.value.decimal.value);
    break;

  case AMQP_FIELD_KIND_UTF8:
    fprintf(out, " %.*s\n", (int)v.value.bytes.len,
            (char *)v.value.bytes.bytes);
    break;

  case AMQP_FIELD_KIND_BYTES:
    fputc(' ', out);
    for (i = 0; i < (int)v.value.bytes.len; i++) {
      fprintf(out, "%02x", ((char *) v.value.bytes.bytes)[i]);
    }

    fputc('\n', out);
    break;

  case AMQP_FIELD_KIND_ARRAY:
    fputc('\n', out);
    for (i = 0; i < v.value.array.num_entries; i++) {
      dump_value(indent + 2, v.value.array.entries[i], out);
    }

    break;

  case AMQP_FIELD_KIND_TIMESTAMP:
    fprintf(out, " %"PRIu64"\n", v.value.u64);
    break;

  case AMQP_FIELD_KIND_TABLE:
    fputc('\n', out);
    for (i = 0; i < v.value.table.num_entries; i++) {
      dump_indent(indent + 2, out);
      fprintf(out, "%.*s ->\n",
              (int)v.value.table.entries[i].key.len,
              (char *)v.value.table.entries[i].key.bytes);
      dump_value(indent + 4, v.value.table.entries[i].value, out);
    }

    break;

  case AMQP_FIELD_KIND_VOID:
    fputc('\n', out);
    break;

  default:
    fprintf(out, "???\n");
    break;
  }
}